

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::clear
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar1 != 0) {
    pvVar2 = (void *)((long)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>)
                            .super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                            super_SmallVectorBase.BeginX + uVar1 * 0x28 + -8);
    lVar3 = uVar1 * -0x28;
    do {
      if (pvVar2 != *(void **)((long)pvVar2 + -0x10)) {
        free(*(void **)((long)pvVar2 + -0x10));
      }
      pvVar2 = (void *)((long)pvVar2 + -0x28);
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0);
  }
  (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size = 0;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->Size = 0;
  }